

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O2

void __thiscall asio::detail::thread_info_base::rethrow_pending_exception(thread_info_base *this)

{
  undefined8 uVar1;
  exception_ptr ex;
  exception_ptr eStack_18;
  exception_ptr local_10;
  
  if (this->has_pending_exception_ < 1) {
    return;
  }
  this->has_pending_exception_ = 0;
  local_10._M_exception_object = (this->pending_exception_)._M_exception_object;
  (this->pending_exception_)._M_exception_object = (void *)0x0;
  std::__exception_ptr::exception_ptr::exception_ptr(&eStack_18,&local_10);
  uVar1 = std::rethrow_exception((exception_ptr)&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_10);
  _Unwind_Resume(uVar1);
}

Assistant:

void rethrow_pending_exception()
  {
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    if (has_pending_exception_ > 0)
    {
      has_pending_exception_ = 0;
      std::exception_ptr ex(
          ASIO_MOVE_CAST(std::exception_ptr)(
            pending_exception_));
      std::rethrow_exception(ex);
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       // && !defined(ASIO_NO_EXCEPTIONS)
  }